

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resldexe.cpp
# Opt level: O0

osfildef * __thiscall CResLoader::open_exe_res(CResLoader *this,char *respath,char *restype)

{
  int iVar1;
  char *pcVar2;
  char *in_RDX;
  long in_RDI;
  CVmImageLoaderMres_resload res_ifc;
  osfildef *exe_fp;
  CVmImageLoaderMres *in_stack_000000a0;
  char *in_stack_000000a8;
  osfildef *in_stack_000000b0;
  char *in_stack_ffffffffffffff58;
  FILE *__stream;
  undefined4 in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff64;
  CVmImageLoaderMres_resload local_58;
  FILE *local_28;
  FILE *local_8;
  
  if ((*(long *)(in_RDI + 8) == 0) || (in_RDX == (char *)0x0)) {
    local_8 = (FILE *)0x0;
  }
  else {
    local_28 = (FILE *)os_exeseek(*(char **)(in_RDI + 8),in_RDX);
    if (local_28 != (FILE *)0x0) {
      CVmImageLoaderMres_resload::CVmImageLoaderMres_resload
                ((CVmImageLoaderMres_resload *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      CVmImageLoader::load_resources_from_fp(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
      iVar1 = CVmImageLoaderMres_resload::found_resource(&local_58);
      if (iVar1 == 0) {
        fclose(local_28);
        local_28 = (FILE *)0x0;
      }
      else {
        pcVar2 = CVmImageLoaderMres_resload::get_link_fname(&local_58);
        if (pcVar2 == (char *)0x0) {
          __stream = local_28;
          in_stack_ffffffffffffff64 = CVmImageLoaderMres_resload::get_resource_seek(&local_58);
          fseek(__stream,(ulong)in_stack_ffffffffffffff64,0);
        }
        else {
          fclose(local_28);
          pcVar2 = CVmImageLoaderMres_resload::get_link_fname(&local_58);
          local_28 = fopen(pcVar2,"rb");
        }
      }
      CVmImageLoaderMres_resload::~CVmImageLoaderMres_resload
                ((CVmImageLoaderMres_resload *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    }
    local_8 = local_28;
  }
  return (osfildef *)local_8;
}

Assistant:

osfildef *CResLoader::open_exe_res(const char *respath,
                                   const char *restype)
{
    osfildef *exe_fp;

    /* 
     *   if we don't have an executable filename stored, or we don't have an
     *   executable resource type ID, we can't load the resource 
     */
    if (exe_filename_ == 0 || restype == 0)
        return 0;
    
    /* find the executable file's resources */
    exe_fp = os_exeseek(exe_filename_, restype);

    /* if we found something, try loading from that file */
    if (exe_fp != 0)
    {
        CVmImageLoaderMres_resload res_ifc(respath);
        
        /* try loading the resources */
        CVmImageLoader::
            load_resources_from_fp(exe_fp, exe_filename_, &res_ifc);
        
        /* check to see if we found it */
        if (res_ifc.found_resource())
        {
            /* check the type */
            if (res_ifc.get_link_fname() != 0)
            {
                /* 
                 *   it's a linked local file - close the exe file and open
                 *   the local file instead 
                 */
                osfcls(exe_fp);
                exe_fp = osfoprb(res_ifc.get_link_fname(), OSFOPRB);
            }
            else
            {
                /* we got an exe resource - seek to the starting byte */
                osfseek(exe_fp, res_ifc.get_resource_seek(), OSFSK_SET);
            }
        }
        else
        {
            /* didn't find it - close and forget the executable file */
            osfcls(exe_fp);
            exe_fp = 0;
        }
    }

    /* return the executable file pointer, if we found the resource */
    return exe_fp;
}